

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

void * mz_zip_reader_extract_to_heap
                 (mz_zip_archive *pZip,mz_uint file_index,size_t *pSize,mz_uint flags)

{
  mz_bool mVar1;
  size_t local_4b0;
  void *pBuf;
  mz_uint64 alloc_size;
  mz_zip_archive_file_stat file_stat;
  mz_uint flags_local;
  size_t *pSize_local;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  
  if (pSize != (size_t *)0x0) {
    *pSize = 0;
  }
  file_stat.m_time._4_4_ = flags;
  mVar1 = mz_zip_reader_file_stat(pZip,file_index,(mz_zip_archive_file_stat *)&alloc_size);
  if (mVar1 == 0) {
    pZip_local = (mz_zip_archive *)0x0;
  }
  else {
    if ((file_stat.m_time._4_4_ & 0x400) == 0) {
      local_4b0 = file_stat.m_comp_size;
    }
    else {
      local_4b0 = file_stat._24_8_;
    }
    pZip_local = (mz_zip_archive *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_4b0);
    if (pZip_local == (mz_zip_archive *)0x0) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      }
      pZip_local = (mz_zip_archive *)0x0;
    }
    else {
      mVar1 = mz_zip_reader_extract_to_mem_no_alloc1
                        (pZip,file_index,pZip_local,local_4b0,file_stat.m_time._4_4_,(void *)0x0,0,
                         (mz_zip_archive_file_stat *)&alloc_size);
      if (mVar1 == 0) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pZip_local);
        pZip_local = (mz_zip_archive *)0x0;
      }
      else if (pSize != (size_t *)0x0) {
        *pSize = local_4b0;
      }
    }
  }
  return pZip_local;
}

Assistant:

void *mz_zip_reader_extract_to_heap(mz_zip_archive *pZip, mz_uint file_index,
                                    size_t *pSize, mz_uint flags) {
  mz_zip_archive_file_stat file_stat;
  mz_uint64 alloc_size;
  void *pBuf;

  if (pSize)
    *pSize = 0;

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return NULL;

  alloc_size = (flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ? file_stat.m_comp_size
                                                     : file_stat.m_uncomp_size;
  if (((sizeof(size_t) == sizeof(mz_uint32))) && (alloc_size > 0x7FFFFFFF)) {
    mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);
    return NULL;
  }

  if (NULL ==
      (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)alloc_size))) {
    mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    return NULL;
  }

  if (!mz_zip_reader_extract_to_mem_no_alloc1(pZip, file_index, pBuf,
                                              (size_t)alloc_size, flags, NULL,
                                              0, &file_stat)) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
    return NULL;
  }

  if (pSize)
    *pSize = (size_t)alloc_size;
  return pBuf;
}